

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_base_loop(event_base *base,int flags)

{
  byte bVar1;
  undefined2 uVar2;
  event_callback *peVar3;
  event_callback *peVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  unsigned_long uVar8;
  timeval *endtime;
  int max_to_process;
  void *pvVar9;
  char *fmt;
  long lVar10;
  timeval *ptVar11;
  eventop *peVar12;
  long lVar13;
  event *peVar14;
  bool bVar15;
  bool bVar16;
  timeval now;
  timeval local_78;
  timeval local_68;
  uint local_4c;
  uint local_48;
  int local_44;
  timeval *local_40;
  eventop *local_38;
  
  peVar12 = base->evsel;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (base->running_loop == 0) {
    base->running_loop = 1;
    (base->tv_cache).tv_sec = 0;
    if (((base->sig).ev_signal_added != 0) && ((base->sig).ev_n_signals_added != 0)) {
      evsig_set_base_(base);
    }
    if (evthread_id_fn_ == (_func_unsigned_long *)0x0) {
      uVar8 = 1;
    }
    else {
      uVar8 = (*evthread_id_fn_)();
    }
    local_40 = &base->tv_cache;
    base->th_owner_id = uVar8;
    base->event_gotterm = 0;
    base->event_break = 0;
    local_4c = flags & 2;
    bVar5 = false;
    local_48 = flags;
    local_38 = peVar12;
    do {
      base->event_continue = 0;
      base->n_deferreds_queued = 0;
      if ((base->event_gotterm != 0) || (base->event_break != 0)) break;
      if (base->event_count_active == 0 && local_4c == 0) {
        if ((base->timeheap).n == 0) {
          peVar14 = (event *)0x0;
        }
        else {
          peVar14 = *(base->timeheap).p;
        }
        if (peVar14 == (event *)0x0) {
          ptVar11 = (timeval *)0x0;
          goto LAB_001ee31f;
        }
        iVar6 = gettime(base,&local_78);
        ptVar11 = &local_68;
        if (iVar6 == -1) goto LAB_001ee31f;
        local_68.tv_sec = (peVar14->ev_timeout).tv_sec;
        bVar16 = SBORROW8(local_68.tv_sec,local_78.tv_sec);
        local_68.tv_sec = local_68.tv_sec - local_78.tv_sec;
        bVar15 = local_68.tv_sec == 0;
        lVar10 = local_68.tv_sec;
        if (bVar15) {
          lVar13 = (peVar14->ev_timeout).tv_usec;
          bVar16 = SBORROW8(lVar13,local_78.tv_usec);
          lVar10 = lVar13 - local_78.tv_usec;
          bVar15 = lVar13 == local_78.tv_usec;
        }
        if (bVar15 || bVar16 != lVar10 < 0) {
          local_68.tv_sec = 0;
          local_68.tv_usec = 0;
          goto LAB_001ee31f;
        }
        local_68.tv_usec = (peVar14->ev_timeout).tv_usec - local_78.tv_usec;
        if (local_68.tv_usec < 0) {
          local_68.tv_sec = local_68.tv_sec + -1;
          local_68.tv_usec = local_68.tv_usec + 1000000;
        }
        if (-1 < local_68.tv_sec) {
          if (local_68.tv_usec < 0) goto LAB_001ee7be;
          if (event_debug_logging_mask_ != 0) {
            event_debugx_("timeout_next: event: %p, in %d seconds, %d useconds",peVar14);
            goto LAB_001ee31a;
          }
          goto LAB_001ee31f;
        }
LAB_001ee7b9:
        event_base_loop_cold_2();
LAB_001ee7be:
        event_base_loop_cold_1();
      }
      local_68.tv_sec = 0;
      local_68.tv_usec = 0;
LAB_001ee31a:
      ptVar11 = &local_68;
LAB_001ee31f:
      if (((((flags & 4U) == 0) && (base->virtual_event_count < 1)) && (base->event_count < 1)) &&
         (base->event_count_active == 0)) {
LAB_001ee79a:
        iVar6 = 1;
        if (event_debug_logging_mask_ == 0) goto LAB_001ee757;
        fmt = "%s: no events registered.";
        goto LAB_001ee749;
      }
      if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
         (iVar6 = evthread_is_debug_lock_held_(base->th_base_lock), iVar6 == 0)) {
        event_base_loop_cold_4();
        goto LAB_001ee7b9;
      }
      while (peVar4 = (base->active_later_queue).tqh_first, peVar4 != (event_callback *)0x0) {
        peVar3 = (peVar4->evcb_active_next).tqe_next;
        if (peVar3 == (event_callback *)0x0) {
          peVar3 = (event_callback *)&base->active_later_queue;
        }
        (peVar3->evcb_active_next).tqe_prev = (peVar4->evcb_active_next).tqe_prev;
        *(peVar4->evcb_active_next).tqe_prev = (peVar4->evcb_active_next).tqe_next;
        uVar2 = peVar4->evcb_flags;
        peVar4->evcb_flags = uVar2 & 0xffd7 | 8;
        bVar1 = peVar4->evcb_pri;
        if (base->nactivequeues <= (int)(uint)bVar1) {
          event_base_loop_cold_3();
          goto LAB_001ee79a;
        }
        (peVar4->evcb_active_next).tqe_next = (event_callback *)0x0;
        (peVar4->evcb_active_next).tqe_prev = base->activequeues[bVar1].tqh_last;
        *base->activequeues[bVar1].tqh_last = peVar4;
        base->activequeues[peVar4->evcb_pri].tqh_last = (event_callback **)peVar4;
        base->n_deferreds_queued = base->n_deferreds_queued + (uint)(peVar4->evcb_closure == '\x03')
        ;
      }
      (base->tv_cache).tv_sec = 0;
      iVar6 = (*peVar12->dispatch)(base,ptVar11);
      if (iVar6 == -1) {
        iVar6 = -1;
        if (event_debug_logging_mask_ == 0) goto LAB_001ee757;
        fmt = "%s: dispatch returned unsuccessfully.";
        goto LAB_001ee749;
      }
      (base->tv_cache).tv_sec = 0;
      if ((base->flags & EVENT_BASE_FLAG_NO_CACHE_TIME) == 0) {
        gettime(base,local_40);
      }
      if ((base->timeheap).n != 0) {
        gettime(base,&local_78);
        while( true ) {
          if ((base->timeheap).n == 0) {
            peVar14 = (event *)0x0;
          }
          else {
            peVar14 = *(base->timeheap).p;
          }
          if (peVar14 == (event *)0x0) break;
          lVar10 = (peVar14->ev_timeout).tv_sec;
          bVar16 = SBORROW8(lVar10,local_78.tv_sec);
          lVar13 = lVar10 - local_78.tv_sec;
          bVar15 = lVar10 == local_78.tv_sec;
          if (bVar15) {
            lVar10 = (peVar14->ev_timeout).tv_usec;
            bVar16 = SBORROW8(lVar10,local_78.tv_usec);
            lVar13 = lVar10 - local_78.tv_usec;
            bVar15 = lVar10 == local_78.tv_usec;
          }
          if (!bVar15 && bVar16 == lVar13 < 0) break;
          event_del_nolock_(peVar14,0);
          if (event_debug_logging_mask_ != 0) {
            event_debugx_("timeout_process: event: %p, call %p",peVar14,
                          (peVar14->ev_evcallback).evcb_cb_union.evcb_callback);
          }
          event_active_nolock_(peVar14,1,1);
        }
      }
      if (base->event_count_active == 0) {
        if (local_4c != 0) {
          bVar5 = true;
        }
      }
      else {
        local_44 = base->max_dispatch_callbacks;
        iVar6 = base->limit_callbacks_after_prio;
        if ((base->max_dispatch_time).tv_sec < 0) {
          ptVar11 = (timeval *)0x0;
        }
        else {
          (base->tv_cache).tv_sec = 0;
          if ((base->flags & EVENT_BASE_FLAG_NO_CACHE_TIME) == 0) {
            gettime(base,local_40);
          }
          ptVar11 = &local_78;
          gettime(base,ptVar11);
          local_78.tv_sec = local_78.tv_sec + (base->max_dispatch_time).tv_sec;
          local_78.tv_usec = local_78.tv_usec + (base->max_dispatch_time).tv_usec;
          if (999999 < local_78.tv_usec) {
            local_78.tv_sec = local_78.tv_sec + 1;
            local_78.tv_usec = local_78.tv_usec + -1000000;
            ptVar11 = &local_78;
          }
        }
        uVar7 = 0;
        if (0 < base->nactivequeues) {
          lVar13 = 0;
          lVar10 = 0;
          do {
            if (*(long *)((long)&base->activequeues->tqh_first + lVar13) != 0) {
              base->event_running_priority = (int)lVar10;
              endtime = ptVar11;
              max_to_process = local_44;
              if (lVar10 < iVar6) {
                endtime = (timeval *)0x0;
                max_to_process = 0x7fffffff;
              }
              uVar7 = event_process_active_single_queue
                                (base,(evcallback_list *)
                                      ((long)&base->activequeues->tqh_first + lVar13),max_to_process
                                 ,endtime);
              if (uVar7 != 0) break;
            }
            lVar10 = lVar10 + 1;
            lVar13 = lVar13 + 0x10;
          } while (lVar10 < base->nactivequeues);
          uVar7 = (uint)(uVar7 != 0);
        }
        base->event_running_priority = -1;
        peVar12 = local_38;
        flags = local_48;
        if ((local_48 & 1) != 0) {
          bVar15 = bVar5;
          if (uVar7 != 0) {
            bVar15 = true;
          }
          if (base->event_count_active == 0) {
            bVar5 = bVar15;
          }
        }
      }
    } while (!bVar5);
    iVar6 = 0;
    if (event_debug_logging_mask_ != 0) {
      fmt = "%s: asked to terminate loop.";
LAB_001ee749:
      event_debugx_(fmt,"event_base_loop");
    }
LAB_001ee757:
    (base->tv_cache).tv_sec = 0;
    base->running_loop = 0;
    pvVar9 = base->th_base_lock;
  }
  else {
    event_warnx("%s: reentrant invocation.  Only one event_base_loop can run on each event_base at once."
                ,"event_base_loop");
    pvVar9 = base->th_base_lock;
    iVar6 = -1;
  }
  if (pvVar9 != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,pvVar9);
  }
  return iVar6;
}

Assistant:

int
event_base_loop(struct event_base *base, int flags)
{
	const struct eventop *evsel = base->evsel;
	struct timeval tv;
	struct timeval *tv_p;
	int res, done, retval = 0;

	/* Grab the lock.  We will release it inside evsel.dispatch, and again
	 * as we invoke user callbacks. */
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (base->running_loop) {
		event_warnx("%s: reentrant invocation.  Only one event_base_loop"
		    " can run on each event_base at once.", __func__);
		EVBASE_RELEASE_LOCK(base, th_base_lock);
		return -1;
	}

	base->running_loop = 1;

	clear_time_cache(base);

	if (base->sig.ev_signal_added && base->sig.ev_n_signals_added)
		evsig_set_base_(base);

	done = 0;

#ifndef EVENT__DISABLE_THREAD_SUPPORT
	base->th_owner_id = EVTHREAD_GET_ID();
#endif

	base->event_gotterm = base->event_break = 0;

	while (!done) {
		base->event_continue = 0;
		base->n_deferreds_queued = 0;

		/* Terminate the loop if we have been asked to */
		if (base->event_gotterm) {
			break;
		}

		if (base->event_break) {
			break;
		}

		tv_p = &tv;
		if (!N_ACTIVE_CALLBACKS(base) && !(flags & EVLOOP_NONBLOCK)) {
			timeout_next(base, &tv_p);
		} else {
			/*
			 * if we have active events, we just poll new events
			 * without waiting.
			 */
			evutil_timerclear(&tv);
		}

		/* If we have no events, we just exit */
		if (0==(flags&EVLOOP_NO_EXIT_ON_EMPTY) &&
		    !event_haveevents(base) && !N_ACTIVE_CALLBACKS(base)) {
			event_debug(("%s: no events registered.", __func__));
			retval = 1;
			goto done;
		}

		event_queue_make_later_events_active(base);

		clear_time_cache(base);

		res = evsel->dispatch(base, tv_p);

		if (res == -1) {
			event_debug(("%s: dispatch returned unsuccessfully.",
				__func__));
			retval = -1;
			goto done;
		}

		update_time_cache(base);

		timeout_process(base);

		if (N_ACTIVE_CALLBACKS(base)) {
			int n = event_process_active(base);
			if ((flags & EVLOOP_ONCE)
			    && N_ACTIVE_CALLBACKS(base) == 0
			    && n != 0)
				done = 1;
		} else if (flags & EVLOOP_NONBLOCK)
			done = 1;
	}
	event_debug(("%s: asked to terminate loop.", __func__));

done:
	clear_time_cache(base);
	base->running_loop = 0;

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	return (retval);
}